

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandReporter.cpp
# Opt level: O2

void __thiscall
ApprovalTests::CommandReporter::useCygwinConversions(CommandReporter *this,bool useCygwin)

{
  undefined7 in_register_00000031;
  __shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2> local_20;
  
  if ((int)CONCAT71(in_register_00000031,useCygwin) == 0) {
    ::std::make_shared<ApprovalTests::DoNothing>();
    ::std::__shared_ptr<ApprovalTests::ConvertForCygwin,(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<ApprovalTests::ConvertForCygwin,(__gnu_cxx::_Lock_policy)2> *)
               &this->converter,
               (__shared_ptr<ApprovalTests::DoNothing,_(__gnu_cxx::_Lock_policy)2> *)&local_20);
  }
  else {
    ::std::make_shared<ApprovalTests::ConvertForCygwin>();
    ::std::__shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->converter).
                super___shared_ptr<ApprovalTests::ConvertForCygwin,_(__gnu_cxx::_Lock_policy)2>,
               &local_20);
  }
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_20._M_refcount);
  return;
}

Assistant:

void CommandReporter::useCygwinConversions(bool useCygwin)
    {
        if (useCygwin)
        {
            converter = std::make_shared<ConvertForCygwin>();
        }
        else
        {
            converter = std::make_shared<DoNothing>();
        }
    }